

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::beta_dist<double>::pdf(beta_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  param_type *in_RDI;
  double in_XMM0_Qa;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  double dVar4;
  double local_8;
  
  if ((0.0 <= in_XMM0_Qa) && (in_XMM0_Qa <= 1.0)) {
    if ((((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) &&
        (rVar2 = param_type::alpha(in_RDI), rVar2 - 1.0 < 0.0)) ||
       (((in_XMM0_Qa == 1.0 && (!NAN(in_XMM0_Qa))) &&
        (rVar2 = param_type::beta(in_RDI), rVar2 - 1.0 < 0.0)))) {
      piVar1 = __errno_location();
      *piVar1 = 0x21;
      local_8 = std::numeric_limits<double>::quiet_NaN();
    }
    else {
      rVar2 = param_type::norm(in_RDI);
      rVar3 = param_type::alpha(in_RDI);
      dVar4 = pow(in_XMM0_Qa,rVar3 - 1.0);
      rVar3 = param_type::beta(in_RDI);
      local_8 = pow(1.0 - in_XMM0_Qa,rVar3 - 1.0);
      local_8 = (1.0 / rVar2) * dVar4 * local_8;
    }
    return local_8;
  }
  return 0.0;
}

Assistant:

pdf(result_type x) const {
      if (x < 0 or x > 1)
        return 0;
      if ((x == 0 and P.alpha() - 1 < 0) or (x == 1 and P.beta() - 1 < 0)) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return 1 / P.norm() * math::pow(x, P.alpha() - 1) * math::pow(1 - x, P.beta() - 1);
    }